

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  uint uVar1;
  size_t size;
  char_t cVar2;
  xpath_memory_block *pxVar3;
  uint uVar4;
  undefined8 uVar5;
  undefined8 __s;
  bool bVar6;
  int iVar7;
  xml_node_struct *pxVar8;
  xpath_ast_node *pxVar9;
  xpath_string *pxVar10;
  xpath_allocator *pxVar11;
  undefined7 extraout_var;
  xpath_node *pxVar12;
  undefined1 *puVar13;
  bool *pbVar14;
  xpath_allocator *pxVar15;
  xpath_string *extraout_RAX;
  char *pcVar16;
  byte *pbVar17;
  size_t sVar18;
  byte bVar19;
  xpath_string *pxVar20;
  long lVar21;
  xml_attribute xVar22;
  ulong uVar23;
  char *pcVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte *pbVar27;
  bool **ppbVar28;
  byte *pbVar29;
  char_t *pcVar30;
  undefined1 *puVar31;
  long lVar32;
  char_t *pcVar33;
  bool *pbVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  xpath_node xVar40;
  double v;
  xpath_allocator_capture local_d8;
  undefined1 local_b0 [16];
  xpath_node *local_a0;
  xpath_allocator *local_90;
  xpath_string *local_88;
  undefined1 local_80 [16];
  ulong local_70;
  undefined1 local_68 [16];
  size_t local_58;
  xpath_stack *local_48;
  xpath_stack local_40;
  
  auVar38 = in_ZMM3._0_16_;
  auVar39 = in_ZMM2._0_16_;
LAB_00125c2c:
  switch(this->_type) {
  case '\x12':
    goto switchD_00125c44_caseD_12;
  default:
    bVar19 = this->_rettype;
    goto LAB_001262e3;
  case '\x14':
    bVar19 = this->_rettype;
    if (((this->_data).variable)->_type != (uint)bVar19) {
      __assert_fail("_rettype == _data.variable->type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2a3b,
                    "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                   );
    }
    if (bVar19 == 3) {
      pcVar16 = *(char **)((this->_data).variable + 1);
      pxVar20 = (xpath_string *)0x185a74;
      if ((xpath_string *)pcVar16 != (xpath_string *)0x0) {
        pxVar20 = (xpath_string *)pcVar16;
      }
      goto LAB_00125fd7;
    }
LAB_001262e3:
    if (bVar19 == 1) {
      local_d8._target = stack->temp;
      local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
      local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
      local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
      local_68._8_8_ = (xml_attribute_struct *)stack->result;
      local_68._0_8_ = local_d8._target;
      eval_node_set((xpath_node_set_raw *)local_b0,this,c,(xpath_stack *)local_68,nodeset_eval_first
                   );
      if ((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]) == local_a0) goto LAB_001263c9;
      xVar40 = xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,
                           local_b0._0_4_);
      string_value(__return_storage_ptr__,(anon_unknown_0 *)xVar40._node._root._root,
                   (xpath_node *)xVar40._attribute._attr._attr,stack->result);
      goto LAB_001267b0;
    }
    if (bVar19 != 2) {
      if (bVar19 != 4) {
        __assert_fail("false && \"Wrong expression for return type string\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2a57,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      bVar6 = eval_boolean(this,c,stack);
      pcVar16 = (char *)CONCAT71(extraout_var,bVar6);
      pcVar24 = "false";
      if (bVar6) {
        pcVar24 = "true";
      }
      __return_storage_ptr__->_buffer = (char_t *)pcVar24;
      goto LAB_001261c4;
    }
    local_d8._target = (xpath_allocator *)eval_number(this,c,stack);
    pxVar11 = stack->result;
    if (((double)local_d8._target == 0.0) && (!NAN((double)local_d8._target))) {
      pcVar16 = (char *)(xpath_string *)0x186c25;
      goto LAB_001261c0;
    }
    if (NAN((double)local_d8._target)) {
      pcVar16 = "NaN";
      goto LAB_001261c0;
    }
    if (((double)local_d8._target + (double)local_d8._target == (double)local_d8._target) &&
       (!NAN((double)local_d8._target + (double)local_d8._target) && !NAN((double)local_d8._target))
       ) {
      pcVar16 = "-Infinity";
      if (0.0 < (double)local_d8._target) {
        pcVar16 = "Infinity";
      }
      goto LAB_001261c0;
    }
    local_90 = local_d8._target;
    snprintf((char *)&local_d8,0x20,"%.*e",0xf);
    pbVar17 = (byte *)strchr((char *)&local_d8,0x65);
    if (pbVar17 == (byte *)0x0) {
      __assert_fail("exponent_string",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2037,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    iVar7 = atoi((char *)(pbVar17 + 1));
    uVar23 = (ulong)((char)local_d8._target == '-');
    bVar19 = *(byte *)((long)&local_d8._target + uVar23);
    if ((bVar19 == 0x30) || (*(char *)((long)&local_d8._target + uVar23 + 1) != '.')) {
      __assert_fail("mantissa[0] != \'0\' && mantissa[1] == \'.\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x203d,
                    "void pugi::impl::(anonymous namespace)::convert_number_to_mantissa_exponent(double, char (&)[32], char **, int *)"
                   );
    }
    pbVar29 = (byte *)((long)&local_d8._target + uVar23 + 1);
    *pbVar29 = bVar19;
    goto LAB_0012686b;
  case '\x19':
    pxVar8 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar8 == (xml_node_struct *)0x0) &&
       (pxVar8 = (c->n)._node._root, pxVar8 == (xml_node_struct *)0x0)) {
      pxVar10 = (xpath_string *)0x185a74;
    }
    else {
      pxVar10 = (xpath_string *)0x185a74;
      if ((xpath_string *)pxVar8->name != (xpath_string *)0x0) {
        pxVar10 = (xpath_string *)pxVar8->name;
      }
    }
    pcVar16 = strchr((char *)pxVar10,0x3a);
    pxVar20 = (xpath_string *)((long)&((xpath_string *)pcVar16)->_buffer + 1);
    if ((xpath_string *)pcVar16 == (xpath_string *)0x0) {
      pxVar20 = pxVar10;
    }
LAB_00125fd7:
    __return_storage_ptr__->_buffer = (char_t *)pxVar20;
    goto LAB_001261c4;
  case '\x1a':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_b0,this->_left,c,stack,nodeset_eval_first);
    xVar40 = xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,local_b0._0_4_)
    ;
    xVar22._attr = xVar40._attribute._attr._attr;
    if ((xVar40._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar22._attr = (xml_attribute_struct *)xVar40._node._root._root,
       xVar40._node._root._root == (xml_node_struct *)0x0)) {
      pcVar30 = "";
    }
    else {
      pcVar30 = "";
      if (((xml_node_struct *)xVar22._attr)->name != (char_t *)0x0) {
        pcVar30 = ((xml_node_struct *)xVar22._attr)->name;
      }
    }
    pcVar16 = strchr((char *)pcVar30,0x3a);
    pcVar33 = (char_t *)(pcVar16 + 1);
    if (pcVar16 == (char *)0x0) {
      pcVar33 = pcVar30;
    }
    __return_storage_ptr__->_buffer = pcVar33;
    goto LAB_001267a4;
  case '\x1b':
    local_d8._target = (xpath_allocator *)(c->n)._node._root;
    local_d8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    pcVar16 = (char *)namespace_uri((xpath_node *)&local_d8);
    goto LAB_001261c0;
  case '\x1c':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_b0,this->_left,c,stack,nodeset_eval_first);
    local_68 = (undefined1  [16])
               xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,
                           local_b0._0_4_);
    pcVar30 = namespace_uri((xpath_node *)local_68);
    goto LAB_001263d0;
  case '\x1d':
    pxVar8 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar8 != (xml_node_struct *)0x0) ||
       (pxVar8 = (c->n)._node._root, pxVar8 != (xml_node_struct *)0x0)) {
      pcVar16 = (char *)(xpath_string *)0x185a74;
      if ((xpath_string *)pxVar8->name != (xpath_string *)0x0) {
        pcVar16 = (char *)pxVar8->name;
      }
      goto LAB_001261c0;
    }
    break;
  case '\x1e':
    local_d8._target = stack->result;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_b0,this->_left,c,stack,nodeset_eval_first);
    xVar40 = xpath_first((xpath_node *)CONCAT71(local_b0._9_7_,local_b0[8]),local_a0,local_b0._0_4_)
    ;
    xVar22._attr = xVar40._attribute._attr._attr;
    if ((xVar40._attribute._attr._attr == (xml_attribute_struct *)0x0) &&
       (xVar22._attr = (xml_attribute_struct *)xVar40._node._root._root,
       xVar40._node._root._root == (xml_node_struct *)0x0)) goto LAB_001263c9;
    pcVar30 = "";
    if (((xml_node_struct *)xVar22._attr)->name != (char_t *)0x0) {
      pcVar30 = ((xml_node_struct *)xVar22._attr)->name;
    }
    goto LAB_001263d0;
  case '\x1f':
    pxVar10 = string_value(__return_storage_ptr__,(anon_unknown_0 *)(c->n)._node._root,
                           (xpath_node *)(c->n)._attribute._attr,stack->result);
    return pxVar10;
  case ' ':
    goto switchD_00125c44_caseD_20;
  case '!':
    local_d8._target = stack->temp;
    lVar21 = 1;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    for (pxVar9 = this->_right; pxVar9 != (xpath_ast_node *)0x0; pxVar9 = pxVar9->_next) {
      lVar21 = lVar21 + 1;
    }
    pxVar11 = (xpath_allocator *)xpath_allocator::allocate(local_d8._target,lVar21 * 0x18);
    if (pxVar11 != (xpath_allocator *)0x0) {
      local_68 = vpermilps_avx((undefined1  [16])*stack,0x4e);
      eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_68);
      pxVar11->_error = (bool *)local_a0;
      pxVar11->_root = (xpath_memory_block *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      pxVar11->_root_size = CONCAT71(local_b0._9_7_,local_b0[8]);
      pxVar9 = this->_right;
      local_90 = pxVar11;
      local_48 = stack;
      if (pxVar9 == (xpath_ast_node *)0x0) {
        lVar32 = 1;
        local_88 = __return_storage_ptr__;
      }
      else {
        lVar32 = 1;
        local_88 = __return_storage_ptr__;
        do {
          eval_string((xpath_string *)local_b0,pxVar9,c,(xpath_stack *)local_68);
          lVar32 = lVar32 + 1;
          pxVar11[1]._error = (bool *)local_a0;
          pxVar11[1]._root = (xpath_memory_block *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
          pxVar11[1]._root_size = CONCAT71(local_b0._9_7_,local_b0[8]);
          pxVar9 = pxVar9->_next;
          pxVar11 = pxVar11 + 1;
        } while (pxVar9 != (xpath_ast_node *)0x0);
      }
      pxVar10 = local_88;
      if (lVar32 != lVar21) {
        __assert_fail("pos == count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x2959,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string_concat(const xpath_context &, const xpath_stack &)"
                     );
      }
      if (lVar21 == 0) {
        pbVar34 = (bool *)0x1;
      }
      else {
        ppbVar28 = &local_90->_error;
        pbVar34 = (bool *)0x0;
        lVar32 = lVar21;
        do {
          if ((char)ppbVar28[-1] == '\x01') {
            pbVar14 = *ppbVar28;
          }
          else {
            pbVar14 = (bool *)strlength((char_t *)((xpath_allocator *)(ppbVar28 + -2))->_root);
          }
          pbVar34 = pbVar34 + (long)pbVar14;
          ppbVar28 = ppbVar28 + 3;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
        pbVar34 = pbVar34 + 1;
      }
      pxVar15 = (xpath_allocator *)xpath_allocator::allocate(local_48->result,(size_t)pbVar34);
      if (pxVar15 == (xpath_allocator *)0x0) {
        pxVar10->_buffer = "";
        pxVar10->_uses_heap = false;
        pxVar10->_length_heap = 0;
        goto LAB_001267b0;
      }
      pxVar11 = pxVar15;
      if (lVar21 != 0) {
        lVar32 = 0;
        do {
          pxVar3 = local_90[lVar32]._root;
          cVar2 = *(char_t *)&pxVar3->next;
          while (cVar2 != '\0') {
            pxVar3 = (xpath_memory_block *)((long)&pxVar3->next + 1);
            *(char_t *)&pxVar11->_root = cVar2;
            pxVar11 = (xpath_allocator *)((long)&pxVar11->_root + 1);
            cVar2 = *(char_t *)pxVar3;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != lVar21);
      }
      *(char_t *)&pxVar11->_root = '\0';
      goto LAB_0012671f;
    }
LAB_001263c9:
    pcVar30 = "";
LAB_001263d0:
    __return_storage_ptr__->_buffer = pcVar30;
LAB_001267a4:
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    goto LAB_001267b0;
  case '$':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_80._8_8_ = stack->result;
    local_80._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    pcVar30 = (char_t *)
              strstr((char *)CONCAT44(local_b0._4_4_,local_b0._0_4_),(char *)local_68._0_8_);
    if (pcVar30 == (char_t *)0x0) goto LAB_001263c9;
    xpath_string::from_heap
              (__return_storage_ptr__,(char_t *)CONCAT44(local_b0._4_4_,local_b0._0_4_),pcVar30,
               stack->result);
    goto LAB_001267b0;
  case '%':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_80._8_8_ = stack->result;
    local_80._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    pcVar30 = (char_t *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
    uVar5 = local_68._0_8_;
    pcVar16 = strstr((char *)pcVar30,(char *)local_68._0_8_);
    if (pcVar16 == (char *)0x0) {
      pcVar33 = "";
    }
    else {
      if (local_68[8] != true) {
        local_58 = strlength((char_t *)uVar5);
        pcVar30 = (char_t *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      }
      if ((bool)local_b0[8] != true) {
        local_a0 = (xpath_node *)strlength(pcVar30);
      }
      pcVar33 = (char_t *)(pcVar16 + local_58);
      if ((local_b0[8] & 1) != 0) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar33,pcVar30 + (long)local_a0,stack->result);
        goto LAB_001267b0;
      }
    }
    __return_storage_ptr__->_buffer = pcVar33;
    goto LAB_001267a4;
  case '&':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_68);
    pxVar12 = local_a0;
    if ((bool)local_b0[8] != true) {
      pxVar12 = (xpath_node *)strlength((char_t *)CONCAT44(local_b0._4_4_,local_b0._0_4_));
    }
    dVar35 = eval_number(this->_right,c,stack);
    pcVar30 = "";
    auVar38._8_8_ = 0;
    auVar38._0_8_ = dVar35 + 0.5;
    auVar38 = vroundsd_avx(auVar38,auVar38,9);
    local_80._0_8_ = auVar38._0_8_;
    puVar31 = (undefined1 *)((long)&(pxVar12->_node)._root + 1);
    auVar39 = vcvtusi2sd_avx512f(auVar39,puVar31);
    if ((double)local_80._0_8_ < auVar39._0_8_) {
      auVar39 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar38);
      lVar21 = vcvttsd2usi_avx512f(auVar39);
      if (puVar31 <= (undefined1 *)(lVar21 - 1U)) {
        __assert_fail("1 <= pos && pos <= s_length + 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x29e0,
                      "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                     );
      }
      pcVar33 = (char_t *)CONCAT44(local_b0._4_4_,local_b0._0_4_);
      if ((bool)local_b0[8] != true) {
        local_a0 = (xpath_node *)strlength(pcVar33);
      }
      pcVar30 = pcVar33 + lVar21 + -1;
      if ((local_b0[8] & 1) == 0) goto LAB_001267a0;
      xpath_string::from_heap(__return_storage_ptr__,pcVar30,pcVar33 + (long)local_a0,stack->result)
      ;
      goto LAB_001267b0;
    }
    goto LAB_001267a0;
  case '\'':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,(xpath_stack *)local_68);
    pxVar12 = local_a0;
    if ((bool)local_b0[8] != true) {
      pxVar12 = (xpath_node *)strlength((char_t *)CONCAT44(local_b0._4_4_,local_b0._0_4_));
    }
    local_90 = (xpath_allocator *)eval_number(this->_right,c,stack);
    dVar35 = eval_number(this->_right->_next,c,stack);
    pcVar30 = "";
    auVar39._8_8_ = 0;
    auVar39._0_8_ = (double)local_90 + 0.5;
    auVar39 = vroundsd_avx(auVar39,auVar39,9);
    pxVar8 = auVar39._0_8_;
    local_80._0_8_ = pxVar8;
    if (!NAN((double)pxVar8)) {
      auVar36._8_8_ = 0;
      auVar36._0_8_ = dVar35 + 0.5;
      auVar36 = vroundsd_avx(auVar36,auVar36,9);
      local_80._0_8_ = (double)pxVar8 + auVar36._0_8_;
      if (!NAN((double)local_80._0_8_)) {
        puVar31 = (undefined1 *)((long)&(pxVar12->_node)._root + 1);
        auVar38 = vcvtusi2sd_avx512f(auVar38,puVar31);
        if ((((double)pxVar8 < auVar38._0_8_) && ((double)pxVar8 < (double)local_80._0_8_)) &&
           (1.0 <= (double)local_80._0_8_)) {
          auVar39 = vmaxsd_avx(ZEXT816(0x3ff0000000000000),auVar39);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_80._0_8_;
          puVar13 = (undefined1 *)vcvttsd2usi_avx512f(auVar37);
          lVar21 = vcvttsd2usi_avx512f(auVar39);
          if (auVar38._0_8_ <= (double)local_80._0_8_) {
            puVar13 = puVar31;
          }
          if ((puVar13 <= (undefined1 *)(lVar21 - 1U)) || (puVar31 < puVar13)) {
            __assert_fail("1 <= pos && pos <= end && end <= s_length + 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x29fc,
                          "xpath_string pugi::impl::(anonymous namespace)::xpath_ast_node::eval_string(const xpath_context &, const xpath_stack &)"
                         );
          }
          pcVar30 = (char_t *)(CONCAT44(local_b0._4_4_,local_b0._0_4_) + -1 + lVar21);
          if ((puVar13 != puVar31) || ((bool)local_b0[8] == true)) {
            xpath_string::from_heap
                      (__return_storage_ptr__,pcVar30,
                       puVar13 + CONCAT44(local_b0._4_4_,local_b0._0_4_) + -1,stack->result);
            goto LAB_001267b0;
          }
        }
      }
    }
LAB_001267a0:
    __return_storage_ptr__->_buffer = pcVar30;
    goto LAB_001267a4;
  case '*':
    string_value((xpath_string *)&local_d8,(anon_unknown_0 *)(c->n)._node._root,
                 (xpath_node *)(c->n)._attribute._attr,stack->result);
    goto LAB_00125ff5;
  case '+':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
LAB_00125ff5:
    pbVar17 = xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar17 != (byte *)0x0) {
      pbVar27 = normalize_space(pbVar17);
      goto LAB_001261af;
    }
    break;
  case ',':
    local_d8._target = stack->temp;
    local_d8._state._root = (xpath_memory_block *)((xml_node_struct *)local_d8._target)->header;
    local_d8._state._root_size = (size_t)((xml_node_struct *)local_d8._target)->name;
    local_d8._state._error = (bool *)((xml_node_struct *)local_d8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_d8._target;
    eval_string((xpath_string *)local_b0,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)local_80,this->_right->_next,c,&local_40);
    pxVar11 = (xpath_allocator *)xpath_string::data((xpath_string *)local_b0,stack->result);
    uVar5 = local_80._0_8_;
    if (pxVar11 == (xpath_allocator *)0x0) goto LAB_001263c9;
    __s = local_68._0_8_;
    local_88 = __return_storage_ptr__;
    if (local_80[8] != true) {
      local_70 = strlength((char_t *)local_80._0_8_);
    }
    bVar19 = *(byte *)&pxVar11->_root;
    pxVar15 = pxVar11;
    local_90 = pxVar11;
    if (bVar19 != 0) goto LAB_00126628;
    goto LAB_00126657;
  case ':':
    eval_string((xpath_string *)&local_d8,this->_left,c,stack);
    pbVar17 = xpath_string::data((xpath_string *)&local_d8,stack->result);
    if (pbVar17 != (byte *)0x0) {
      bVar19 = *pbVar17;
      pbVar27 = pbVar17;
      if (bVar19 != 0) {
        pcVar30 = (this->_data).string;
        pbVar29 = pbVar17;
        do {
          pbVar29 = pbVar29 + 1;
          if ((char)bVar19 < '\0') {
            uVar23 = 1;
          }
          else {
            bVar19 = pcVar30[bVar19];
            uVar23 = (ulong)(-1 < (char)bVar19);
          }
          *pbVar27 = bVar19;
          pbVar27 = pbVar27 + uVar23;
          bVar19 = *pbVar29;
        } while (bVar19 != 0);
      }
      *pbVar27 = 0;
      goto LAB_001261af;
    }
  }
  pcVar16 = (char *)(xpath_string *)0x185a74;
  goto LAB_001261c0;
LAB_00126628:
  pxVar15 = (xpath_allocator *)((long)&pxVar15->_root + 1);
  pcVar16 = strchr((char *)__s,(uint)bVar19);
  if (pcVar16 == (char *)0x0) {
LAB_00126645:
    *(byte *)&pxVar11->_root = bVar19;
    pxVar11 = (xpath_allocator *)((long)&pxVar11->_root + 1);
  }
  else {
    uVar23 = (long)pcVar16 - __s;
    if (uVar23 < local_70) {
      bVar19 = *(byte *)(uVar5 + uVar23);
      goto LAB_00126645;
    }
  }
  bVar19 = *(byte *)&pxVar15->_root;
  if (bVar19 == 0) {
LAB_00126657:
    *(char_t *)&pxVar11->_root = '\0';
    pxVar15 = local_90;
    pxVar10 = local_88;
LAB_0012671f:
    xpath_string::from_heap_preallocated(pxVar10,(char_t *)pxVar15,(char_t *)pxVar11);
LAB_001267b0:
    xpath_allocator_capture::~xpath_allocator_capture(&local_d8);
    return extraout_RAX;
  }
  goto LAB_00126628;
switchD_00125c44_caseD_20:
  this = this->_left;
  goto LAB_00125c2c;
switchD_00125c44_caseD_12:
  pcVar16 = (char *)(this->_data).string;
LAB_001261c0:
  __return_storage_ptr__->_buffer = (char_t *)pcVar16;
LAB_001261c4:
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return (xpath_string *)pcVar16;
  while (pbVar25 = pbVar17 + -1, pbVar27 = pbVar17, pbVar17 = pbVar17 + -1, *pbVar25 == 0x30) {
LAB_0012686b:
    pbVar27 = pbVar29;
    if (pbVar17 == pbVar29) break;
  }
  uVar1 = iVar7 + 1;
  *pbVar27 = 0;
  sVar18 = strlen((char *)&local_d8);
  uVar4 = -uVar1;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  size = (ulong)uVar4 + 4 + sVar18;
  pbVar17 = (byte *)xpath_allocator::allocate(pxVar11,size);
  if (pbVar17 == (byte *)0x0) {
    __return_storage_ptr__->_buffer = "";
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    return (xpath_string *)0x185a74;
  }
  pbVar25 = pbVar17;
  if ((double)local_90 < 0.0) {
    pbVar25 = pbVar17 + 1;
    *pbVar17 = 0x2d;
  }
  if (iVar7 < 0) {
    *pbVar25 = 0x30;
    pbVar27 = pbVar25 + 1;
    if (*pbVar29 == 0) goto LAB_001269bd;
    pbVar25[1] = 0x2e;
    pbVar27 = pbVar25 + 2;
    if (iVar7 != -1) {
      local_88 = __return_storage_ptr__;
      memset(pbVar27,0x30,(ulong)(-iVar7 - 2) + 1);
      pbVar27 = pbVar25 + (ulong)(-iVar7 - 2) + 3;
      __return_storage_ptr__ = local_88;
    }
  }
  else {
    iVar7 = iVar7 + 2;
    do {
      pbVar26 = pbVar25;
      bVar19 = *pbVar29;
      if (9 < bVar19 - 0x30 && bVar19 != 0) {
        __assert_fail("*mantissa == 0 || static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x206e,
                      "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                     );
      }
      bVar6 = bVar19 != 0;
      if (!bVar6) {
        bVar19 = 0x30;
      }
      iVar7 = iVar7 + -1;
      *pbVar26 = bVar19;
      pbVar29 = pbVar29 + bVar6;
      pbVar27 = pbVar26 + 1;
      pbVar25 = pbVar27;
    } while (1 < iVar7);
    if (*pbVar29 == 0) goto LAB_001269bd;
    *pbVar27 = 0x2e;
    pbVar27 = pbVar26 + 2;
  }
  bVar19 = *pbVar29;
  while (bVar19 != 0) {
    pbVar29 = pbVar29 + 1;
    if (9 < bVar19 - 0x30) {
      __assert_fail("static_cast<unsigned int>(*mantissa - \'0\') <= 9",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2084,
                    "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                   );
    }
    *pbVar27 = bVar19;
    pbVar27 = pbVar27 + 1;
    bVar19 = *pbVar29;
  }
LAB_001269bd:
  if (pbVar17 + size <= pbVar27) {
    __assert_fail("s < result + result_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x208a,
                  "xpath_string pugi::impl::(anonymous namespace)::convert_number_to_string(double, xpath_allocator *)"
                 );
  }
  *pbVar27 = 0;
LAB_001261af:
  pxVar10 = xpath_string::from_heap_preallocated(__return_storage_ptr__,pbVar17,pbVar27);
  return pxVar10;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= s_length + 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= s_length + 1) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= s_length + 1 ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());
			}

			// fallthrough
			default:
			{
				switch (_rettype)
				{
				case xpath_type_boolean:
					return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

				case xpath_type_number:
					return convert_number_to_string(eval_number(c, stack), stack.result);

				case xpath_type_node_set:
				{
					xpath_allocator_capture cr(stack.temp);

					xpath_stack swapped_stack = {stack.temp, stack.result};

					xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
					return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
				}

				default:
					assert(false && "Wrong expression for return type string"); // unreachable
					return xpath_string();
				}
			}
			}
		}